

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_comparison_join.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalComparisonJoin *op)

{
  LogicalOperatorType LVar1;
  PhysicalOperator *pPVar2;
  InternalException *this_00;
  string local_40;
  
  LVar1 = (op->super_LogicalJoin).super_LogicalOperator.type;
  if (LVar1 == LOGICAL_DELIM_JOIN) {
    pPVar2 = PlanDelimJoin(this,op);
    return pPVar2;
  }
  if (LVar1 != LOGICAL_COMPARISON_JOIN) {
    if (LVar1 == LOGICAL_ASOF_JOIN) {
      pPVar2 = PlanAsOfJoin(this,op);
      return pPVar2;
    }
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unrecognized operator type for LogicalComparisonJoin","");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pPVar2 = PlanComparisonJoin(this,op);
  return pPVar2;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalComparisonJoin &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
		return PlanAsOfJoin(op);
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
		return PlanComparisonJoin(op);
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
		return PlanDelimJoin(op);
	default:
		throw InternalException("Unrecognized operator type for LogicalComparisonJoin");
	}
}